

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

unsigned_long __thiscall
el::base::TypedConfigurations::unsafeGetConfigByVal<unsigned_long>
          (TypedConfigurations *this,Level level,
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,char *confName)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  bool bVar5;
  key_type local_4;
  
  p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
  p_Var3 = (confMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar5]) {
    bVar5 = p_Var3[1]._M_color < level;
    if (!bVar5) {
      p_Var4 = p_Var3;
    }
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var3 = p_Var4, level < p_Var4[1]._M_color)) {
    p_Var3 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var3 == p_Var1) {
    pmVar2 = utils::std::
             map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
             ::at(confMap,&local_4);
    p_Var3 = (_Base_ptr)*pmVar2;
  }
  else {
    p_Var3 = p_Var3[1]._M_parent;
  }
  return (unsigned_long)p_Var3;
}

Assistant:

Conf_T unsafeGetConfigByVal(Level level, const std::map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::map<Level, Conf_T>::const_iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
        return Conf_T();
      }
    }
    return it->second;
  }